

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

void __thiscall F3DFloor::UpdateColormap(F3DFloor *this,FDynamicColormap **map)

{
  uint32 uVar1;
  uint32 uVar2;
  FDynamicColormap *pFVar3;
  FDynamicColormap **map_local;
  F3DFloor *this_local;
  
  uVar1 = PalEntry::operator_cast_to_unsigned_int(&this->target->ColorMap->Fade);
  if (((uVar1 != 0) ||
      (uVar1 = PalEntry::operator_cast_to_unsigned_int(&this->model->ColorMap->Fade), uVar1 != 0))
     && ((this->flags & 0x8000000) == 0)) {
    uVar1 = PalEntry::operator_cast_to_unsigned_int(&this->target->ColorMap->Fade);
    uVar2 = PalEntry::operator_cast_to_unsigned_int(&this->model->ColorMap->Fade);
    if (uVar1 != uVar2) {
      uVar1 = PalEntry::operator_cast_to_unsigned_int(&(*map)->Color);
      uVar2 = PalEntry::operator_cast_to_unsigned_int(&this->model->ColorMap->Color);
      if (uVar1 == uVar2) {
        uVar1 = PalEntry::operator_cast_to_unsigned_int(&(*map)->Fade);
        uVar2 = PalEntry::operator_cast_to_unsigned_int(&this->target->ColorMap->Fade);
        if ((uVar1 == uVar2) && ((*map)->Desaturate == this->model->ColorMap->Desaturate)) {
          return;
        }
      }
      pFVar3 = GetSpecialLights((PalEntry)(this->model->ColorMap->Color).field_0.field_0,
                                (PalEntry)(this->target->ColorMap->Fade).field_0.field_0,
                                this->model->ColorMap->Desaturate);
      *map = pFVar3;
      return;
    }
  }
  *map = this->model->ColorMap;
  return;
}

Assistant:

void F3DFloor::UpdateColormap(FDynamicColormap *&map)
{
	// If there's no fog in either model or target sector (or both have the same fog) this is easy and fast.
	if ((target->ColorMap->Fade == 0 && model->ColorMap->Fade == 0) || (flags & FF_FADEWALLS) ||
		target->ColorMap->Fade == model->ColorMap->Fade)
	{
		map = model->ColorMap;
	}
	else
	{
		// since rebuilding the map is not a cheap operation let's only do it if something really changed.
		if (map->Color != model->ColorMap->Color || map->Fade != target->ColorMap->Fade ||
			map->Desaturate != model->ColorMap->Desaturate)
		{
			map = GetSpecialLights(model->ColorMap->Color, target->ColorMap->Fade, model->ColorMap->Desaturate);
		}
	}
}